

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O0

size_t rcnb_encode_block(char *plaintext_in,size_t length_in,wchar_t *code_out,
                        rcnb_encodestate *state_in)

{
  byte *in_RCX;
  wchar_t *in_RDX;
  ulong in_RSI;
  undefined1 *in_RDI;
  wchar_t i;
  wchar_t *code_char;
  int local_34;
  wchar_t *local_30;
  byte *local_28;
  wchar_t *local_20;
  ulong local_18;
  undefined1 *local_10;
  size_t local_8;
  
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else {
    local_30 = in_RDX;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((*in_RCX & 1) != 0) {
      rcnb_encode_short(CONCAT11(in_RCX[1],*in_RDI),&local_30);
      local_10 = local_10 + 1;
      local_18 = local_18 - 1;
      *local_28 = 0;
    }
    for (local_34 = 0; (ulong)(long)local_34 < local_18 >> 1; local_34 = local_34 + 1) {
      rcnb_encode_short(CONCAT11(local_10[local_34 << 1],local_10[local_34 * 2 + 1]),&local_30);
    }
    if ((local_18 & 1) != 0) {
      local_28[1] = local_10[local_18 - 1];
      *local_28 = 1;
    }
    *local_30 = L'\0';
    local_8 = (long)local_30 - (long)local_20 >> 2;
  }
  return local_8;
}

Assistant:

size_t rcnb_encode_block(const char* plaintext_in, size_t length_in,
        wchar_t* const code_out, rcnb_encodestate* state_in)
{
    if (length_in == 0)
        return 0;
    wchar_t* code_char = code_out;
    if (state_in->cached) {
        rcnb_encode_short(*(unsigned char*)(&state_in->trailing_byte) << 8 | *(unsigned char*)(&plaintext_in[0]),
                &code_char);
        plaintext_in++;
        length_in--;
        state_in->cached = false;
    }
#if defined(ENABLE_AVX2) || defined(ENABLE_SSSE3) || defined(ENABLE_NEON)
    size_t batch = length_in >> 5;
    if (batch > 0) {
        rcnb_encode_32n_asm(plaintext_in, (char *) code_char, batch);
    }
    plaintext_in += 32 * batch;
    code_char += 64 * batch;
    length_in = length_in & 31;
#endif
    for (int i = 0; i < (length_in >> 1); ++i)
        rcnb_encode_short(*(unsigned char*)(&plaintext_in[i * 2]) << 8 | *(unsigned char*)(&plaintext_in[i * 2 + 1]),
                &code_char);
    if (length_in & 1) {
        state_in->trailing_byte = plaintext_in[length_in - 1];
        state_in->cached = true;
    }
    *code_char = 0;
    return code_char - code_out;
}